

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O1

shared_ptr<bytecode::CompiledFile> compile(shared_ptr<ScriptAstNode> *script)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  shared_ptr<bytecode::CompiledFile> sVar1;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00130cc0;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  in_RSI[1] = 0;
  *in_RSI = 0;
  compiler::AstCompiler::compile((AstCompiler *)script,(shared_ptr<ScriptAstNode> *)(this_00 + 1));
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  sVar1.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)script;
  return (shared_ptr<bytecode::CompiledFile>)
         sVar1.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<bytecode::CompiledFile> compile(std::shared_ptr<ScriptAstNode> script) {
  auto compiler = std::make_shared<compiler::AstCompiler>();
  return compiler->compile(std::move(script));
}